

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDocumentHandler.cpp
# Opt level: O2

EStatusCode __thiscall
PDFDocumentHandler::CopyPageContentToTargetPageRecoded
          (PDFDocumentHandler *this,PDFPage *inPage,PDFDictionary *inPageObject)

{
  PDFParser *this_00;
  EPDFObjectType EVar1;
  EStatusCode EVar2;
  PageContentContext *inContentContext;
  PDFObject *inOriginal;
  PDFStreamInput *inContentSource;
  Trace *pTVar3;
  char *pcVar4;
  RefCountPtr<PDFObject> pageContent;
  PDFObjectCastPtr<PDFIndirectObjectReference> refItem;
  SingleValueContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_> it;
  PDFObjectCastPtr<PDFStreamInput> contentStream;
  
  this_00 = this->mParser;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&it,"Contents",(allocator<char> *)&refItem);
  pageContent.mValue = PDFParser::QueryDictionaryObject(this_00,inPageObject,(string *)&it);
  pageContent._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_0036d890;
  std::__cxx11::string::~string((string *)&it);
  EVar2 = eSuccess;
  if (pageContent.mValue == (PDFObject *)0x0) goto LAB_0019a45b;
  inContentContext =
       PDFHummus::DocumentContext::StartPageContentContext(this->mDocumentContext,inPage);
  EVar1 = PDFObject::GetType(pageContent.mValue);
  if (EVar1 == ePDFObjectStream) {
    EVar2 = WritePDFStreamInputToContentContext
                      (this,inContentContext,(PDFStreamInput *)pageContent.mValue);
LAB_0019a438:
    if (EVar2 == eSuccess) {
      PDFHummus::DocumentContext::EndPageContentContext(this->mDocumentContext,inContentContext);
      EVar2 = eSuccess;
      goto LAB_0019a45b;
    }
  }
  else {
    EVar1 = PDFObject::GetType(pageContent.mValue);
    if (EVar1 == ePDFObjectArray) {
      PDFArray::GetIterator((PDFArray *)pageContent.mValue);
      refItem.super_RefCountPtr<PDFIndirectObjectReference>.mValue =
           (PDFIndirectObjectReference *)0x0;
      refItem.super_RefCountPtr<PDFIndirectObjectReference>._vptr_RefCountPtr =
           (_func_int **)&PTR__RefCountPtr_0036db20;
      EVar2 = eSuccess;
      do {
        if (it.super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>.
            mCurrentPosition._M_current ==
            it.super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>.
            mEndPosition._M_current) break;
        if (it.super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>.
            mFirstMove == true) {
          it.super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>.
          mFirstMove = false;
          if (EVar2 != eSuccess) break;
        }
        else {
          it.super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>.
          mCurrentPosition._M_current =
               it.super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>.
               mCurrentPosition._M_current + 1;
          if ((EVar2 != eSuccess) ||
             (it.super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>.
              mCurrentPosition._M_current ==
              it.super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>.
              mEndPosition._M_current)) break;
        }
        PDFObjectCastPtr<PDFIndirectObjectReference>::operator=
                  (&refItem,*it.
                             super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
                             .mCurrentPosition._M_current);
        if (refItem.super_RefCountPtr<PDFIndirectObjectReference>.mValue ==
            (PDFIndirectObjectReference *)0x0) {
          pTVar3 = Trace::DefaultTrace();
          Trace::TraceToLog(pTVar3,
                            "PDFDocumentHandler::CopyPageContentToTargetPageRecoded, content stream array contains non-refs"
                           );
          EVar2 = eFailure;
          break;
        }
        inOriginal = PDFParser::ParseNewObject
                               (this->mParser,
                                (refItem.super_RefCountPtr<PDFIndirectObjectReference>.mValue)->
                                mObjectID);
        inContentSource = PDFObjectCast<PDFStreamInput>(inOriginal);
        contentStream.super_RefCountPtr<PDFStreamInput>._vptr_RefCountPtr =
             (_func_int **)&PTR__RefCountPtr_0036d930;
        contentStream.super_RefCountPtr<PDFStreamInput>.mValue = inContentSource;
        if (inContentSource == (PDFStreamInput *)0x0) {
          pTVar3 = Trace::DefaultTrace();
          Trace::TraceToLog(pTVar3,
                            "PDFDocumentHandler::CopyPageContentToTargetPageRecoded, content stream array contains references to non streams"
                           );
          EVar2 = eFailure;
        }
        else {
          EVar2 = WritePDFStreamInputToContentContext(this,inContentContext,inContentSource);
        }
        RefCountPtr<PDFStreamInput>::~RefCountPtr(&contentStream.super_RefCountPtr<PDFStreamInput>);
      } while (inContentSource != (PDFStreamInput *)0x0);
      RefCountPtr<PDFIndirectObjectReference>::~RefCountPtr
                (&refItem.super_RefCountPtr<PDFIndirectObjectReference>);
      goto LAB_0019a438;
    }
    pTVar3 = Trace::DefaultTrace();
    EVar1 = PDFObject::GetType(pageContent.mValue);
    pcVar4 = PDFObject::scPDFObjectTypeLabel(EVar1);
    Trace::TraceToLog(pTVar3,
                      "PDFDocumentHandler::CopyPageContentToTargetPageRecoded, error copying page content, expected either array or stream, getting %s"
                      ,pcVar4);
    EVar2 = eFailure;
  }
  if (inContentContext != (PageContentContext *)0x0) {
    (*(inContentContext->super_AbstractContentContext)._vptr_AbstractContentContext[1])
              (inContentContext);
  }
LAB_0019a45b:
  RefCountPtr<PDFObject>::~RefCountPtr(&pageContent);
  return EVar2;
}

Assistant:

EStatusCode PDFDocumentHandler::CopyPageContentToTargetPageRecoded(PDFPage* inPage,PDFDictionary* inPageObject)
{
	EStatusCode status = PDFHummus::eSuccess;
    
	RefCountPtr<PDFObject> pageContent(mParser->QueryDictionaryObject(inPageObject,"Contents"));
    
    // for empty page, do nothing
    if(!pageContent)
        return status;
    
	PageContentContext* pageContentContext = mDocumentContext->StartPageContentContext(inPage);
	if(pageContent->GetType() == PDFObject::ePDFObjectStream)
	{
		status = WritePDFStreamInputToContentContext(pageContentContext,(PDFStreamInput*)pageContent.GetPtr());
	}
	else if(pageContent->GetType() == PDFObject::ePDFObjectArray)
	{
		SingleValueContainerIterator<PDFObjectVector> it = ((PDFArray*)pageContent.GetPtr())->GetIterator();
		PDFObjectCastPtr<PDFIndirectObjectReference> refItem;
		while(it.MoveNext() && status == PDFHummus::eSuccess)
		{
			refItem = it.GetItem();
			if(!refItem)
			{
				status = PDFHummus::eFailure;
				TRACE_LOG("PDFDocumentHandler::CopyPageContentToTargetPageRecoded, content stream array contains non-refs");
				break;
			}
			PDFObjectCastPtr<PDFStreamInput> contentStream(mParser->ParseNewObject(refItem->mObjectID));
			if(!contentStream)
			{
				status = PDFHummus::eFailure;
				TRACE_LOG("PDFDocumentHandler::CopyPageContentToTargetPageRecoded, content stream array contains references to non streams");
				break;
			}
			status = WritePDFStreamInputToContentContext(pageContentContext,contentStream.GetPtr());
		}
	}
	else
	{
		TRACE_LOG1("PDFDocumentHandler::CopyPageContentToTargetPageRecoded, error copying page content, expected either array or stream, getting %s",PDFObject::scPDFObjectTypeLabel(pageContent->GetType()));
		status = PDFHummus::eFailure;
	}
	
	if(status != PDFHummus::eSuccess)
	{
		delete pageContentContext;
	}
	else
	{
		mDocumentContext->EndPageContentContext(pageContentContext);
	}
	return status;
}